

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentOnSelf<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  initializer_list<std::pair<const_int,_phmap::priv::NonStandardLayout>_> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
  *m_00;
  initializer_list<std::pair<const_int,_phmap::priv::NonStandardLayout>_> xs;
  pair<const_int,_phmap::priv::NonStandardLayout> *local_690;
  AssertHelper local_670;
  Message local_668;
  vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
  local_660;
  iterator local_648;
  iterator ppStack_640;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_> local_630;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_610;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_5d8;
  StatefulTestingHash local_5d0;
  iterator local_5c8;
  size_type sStack_5c0;
  undefined1 local_5b0 [8];
  TypeParam m;
  pair<const_int,_phmap::priv::NonStandardLayout> local_118;
  pair<const_int,_phmap::priv::NonStandardLayout> local_e8;
  pair<const_int,_phmap::priv::NonStandardLayout> local_b8;
  pair<const_int,_phmap::priv::NonStandardLayout> local_88;
  pair<const_int,_phmap::priv::NonStandardLayout> local_58;
  iterator ppStack_28;
  initializer_list<std::pair<const_int,_phmap::priv::NonStandardLayout>_> values;
  Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> gen;
  AssignmentOnSelf<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *matcher;
  
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_118,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_e8,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_b8,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_88,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_58,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)
             ((long)&values._M_len + 7));
  local_5c8 = &local_118;
  values._M_array = (iterator)0x5;
  sStack_5c0 = 5;
  local_5d0.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  ppStack_28 = local_5c8;
  StatefulTestingHash::StatefulTestingHash(&local_5d0);
  local_5d8.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_5d8);
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>::Alloc
            ((Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *)&gtest_ar.message_,0);
  iVar1._M_len = sStack_5c0;
  iVar1._M_array = local_5c8;
  sVar3 = 0;
  parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
                       *)local_5b0,iVar1,0,&local_5d0,&local_5d8,
                      (allocator_type *)&gtest_ar.message_);
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>::~Alloc
            ((Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *)&gtest_ar.message_);
  parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
  ::operator=((parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
               *)local_5b0,
              (parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
               *)local_5b0);
  local_648 = ppStack_28;
  ppStack_640 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  testing::UnorderedElementsAreArray<std::pair<int_const,phmap::priv::NonStandardLayout>>
            (&local_630,(testing *)ppStack_28,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,phmap::priv::NonStandardLayout>>>
            (&local_610,(internal *)&local_630,matcher);
  items<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>>
            (&local_660,(priv *)local_5b0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::operator()(local_5f0,(char *)&local_610,
               (vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
                *)"items(m)");
  std::
  vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector(&local_660);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~PredicateFormatterFromMatcher(&local_610);
  testing::internal::
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_phmap::priv::NonStandardLayout>_>::
  ~UnorderedElementsAreArrayMatcher(&local_630);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar2) {
    testing::Message::Message(&local_668);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1db,message);
    testing::internal::AssertHelper::operator=(&local_670,&local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
              *)local_5b0);
  local_690 = (pair<const_int,_phmap::priv::NonStandardLayout> *)&ppStack_28;
  do {
    local_690 = local_690 + -1;
    std::pair<const_int,_phmap::priv::NonStandardLayout>::~pair(local_690);
  } while (local_690 != &local_118);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}